

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_namespace::dump(statement_namespace *this,ostream *o)

{
  bool bVar1;
  ostream *poVar2;
  ostream *in_RSI;
  _Self *in_RDI;
  statement_base **ptr;
  const_iterator __end1;
  const_iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  *in_stack_ffffffffffffffa0;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_38;
  _Self *local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RSI,"< BeginNamespace: ID = \"");
  poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 1));
  std::operator<<(poVar2,"\" >\n");
  local_18 = in_RDI + 2;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDI);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDI);
  while( true ) {
    bVar1 = std::operator!=(in_stack_ffffffffffffffa0,in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffa0 =
         (_Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
          *)std::
            _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
            ::operator*(&local_38);
    (*((statement_base *)in_stack_ffffffffffffffa0->_M_cur)->_vptr_statement_base[5])
              ((statement_base *)in_stack_ffffffffffffffa0->_M_cur,local_10);
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator++(in_stack_ffffffffffffffa0);
  }
  std::operator<<(local_10,"< EndNamespace >\n");
  return;
}

Assistant:

void statement_namespace::dump(std::ostream &o) const
	{
		o << "< BeginNamespace: ID = \"" << mName << "\" >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndNamespace >\n";
	}